

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID ImGui::AddContextHook(ImGuiContext_conflict1 *ctx,ImGuiContextHook *hook)

{
  uint uVar1;
  int *piVar2;
  ImGuiContextHookCallback *pp_Var3;
  int iVar4;
  ImGuiContextHook *pIVar5;
  void *pvVar6;
  ImGuiContextHookType IVar7;
  ImGuiID IVar8;
  undefined4 uVar9;
  ImGuiID IVar10;
  ImGuiContextHook *__dest;
  int iVar11;
  int iVar12;
  
  if (((hook->Callback == (ImGuiContextHookCallback)0x0) || (hook->HookId != 0)) ||
     (hook->Type == ImGuiContextHookType_PendingRemoval_)) {
    __assert_fail("hook->Callback != __null && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0xdba,"ImGuiID ImGui::AddContextHook(ImGuiContext *, const ImGuiContextHook *)");
  }
  iVar12 = (ctx->Hooks).Size;
  iVar4 = (ctx->Hooks).Capacity;
  if (iVar12 == iVar4) {
    iVar12 = iVar12 + 1;
    if (iVar4 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar4 / 2 + iVar4;
    }
    if (iVar12 < iVar11) {
      iVar12 = iVar11;
    }
    if (iVar4 < iVar12) {
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + 1;
      }
      __dest = (ImGuiContextHook *)(*GImAllocatorAllocFunc)((long)iVar12 << 5,GImAllocatorUserData);
      pIVar5 = (ctx->Hooks).Data;
      if (pIVar5 != (ImGuiContextHook *)0x0) {
        memcpy(__dest,pIVar5,(long)(ctx->Hooks).Size << 5);
        pIVar5 = (ctx->Hooks).Data;
        if ((pIVar5 != (ImGuiContextHook *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
          piVar2 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar2 = *piVar2 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      }
      (ctx->Hooks).Data = __dest;
      (ctx->Hooks).Capacity = iVar12;
    }
  }
  pIVar5 = (ctx->Hooks).Data;
  iVar12 = (ctx->Hooks).Size;
  IVar10 = hook->HookId;
  IVar7 = hook->Type;
  IVar8 = hook->Owner;
  uVar9 = *(undefined4 *)&hook->field_0xc;
  pvVar6 = hook->UserData;
  pp_Var3 = &pIVar5[iVar12].Callback;
  *pp_Var3 = hook->Callback;
  pp_Var3[1] = (ImGuiContextHookCallback)pvVar6;
  pIVar5 = pIVar5 + iVar12;
  pIVar5->HookId = IVar10;
  pIVar5->Type = IVar7;
  pIVar5->Owner = IVar8;
  *(undefined4 *)&pIVar5->field_0xc = uVar9;
  iVar12 = (ctx->Hooks).Size;
  IVar10 = ctx->HookIdNext;
  uVar1 = iVar12 + 1;
  (ctx->Hooks).Size = uVar1;
  IVar10 = IVar10 + 1;
  ctx->HookIdNext = IVar10;
  if (-1 < iVar12) {
    (ctx->Hooks).Data[(ulong)uVar1 - 1].HookId = IVar10;
    return IVar10;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                ,0x70f,"T &ImVector<ImGuiContextHook>::back() [T = ImGuiContextHook]");
}

Assistant:

ImGuiID ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_);
    g.Hooks.push_back(*hook);
    g.Hooks.back().HookId = ++g.HookIdNext;
    return g.HookIdNext;
}